

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

char * cs_impl::
       try_convert_and_check<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_1UL>
       ::convert(var *val)

{
  bool bVar1;
  type_info *ptVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  runtime_error *this;
  char *name;
  char *name_00;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  ptVar2 = any::type(val);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&std::__cxx11::string::typeinfo);
  if (bVar1) {
    pbVar3 = any::const_val<std::__cxx11::string>(val);
  }
  else {
    ptVar2 = any::type(val);
    bVar1 = std::type_info::operator==(ptVar2,(type_info *)&char_const*::typeinfo);
    if (!bVar1) {
      this = (runtime_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::to_string(&local_120,2);
      std::operator+(&local_100,"Invalid Argument. At ",&local_120);
      std::operator+(&local_e0,&local_100,". Expected ");
      cxx_demangle_abi_cxx11_
                (&local_140,(cs_impl *)(_future_category + (*_future_category == '*')),name);
      std::operator+(&local_c0,&local_e0,&local_140);
      std::operator+(&local_a0,&local_c0,", compatible with ");
      cxx_demangle_abi_cxx11_(&local_160,(cs_impl *)"cs::string",name_00);
      std::operator+(&local_80,&local_a0,&local_160);
      std::operator+(&local_60,&local_80,", provided ");
      any::get_type_name_abi_cxx11_(&local_180,val);
      std::operator+(&local_40,&local_60,&local_180);
      cs::runtime_error::runtime_error(this,&local_40);
      __cxa_throw(this,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             any::const_val<char_const*>(val);
  }
  return (pbVar3->_M_dataplus)._M_p;
}

Assistant:

inline static _TargetT convert(cs::var &val)
		{
			if (val.type() == typeid(_SourceT))
				return type_convertor<_SourceT, _TargetT>::convert(convert_helper<_SourceT>::get_val(val));
			else if (val.type() == typeid(_TargetT))
				return convert_helper<_TargetT>::get_val(val);
			else
				throw cs::runtime_error("Invalid Argument. At " + std::to_string(index + 1) + ". Expected " +
				                        cxx_demangle(get_name_of_type<_TargetT>()) + ", compatible with " +
				                        cxx_demangle(get_name_of_type<_SourceT>()) + ", provided " +
				                        val.get_type_name());
		}